

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_layout_ratio_from_pixel(nk_context *ctx,float pixel_width)

{
  nk_window *pnVar1;
  float fVar2;
  uint uVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x45da,"float nk_layout_ratio_from_pixel(struct nk_context *, float)");
  }
  fVar2 = 0.0;
  if ((pixel_width == 0.0) && (!NAN(pixel_width))) {
    __assert_fail("pixel_width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x45db,"float nk_layout_ratio_from_pixel(struct nk_context *, float)");
  }
  pnVar1 = ctx->current;
  if ((pnVar1 != (nk_window *)0x0) && (pnVar1->layout != (nk_panel *)0x0)) {
    fVar2 = pixel_width / (pnVar1->bounds).x;
    uVar3 = 0;
    if (0.0 <= fVar2) {
      uVar3 = 0x3f800000;
    }
    if (fVar2 < 0.0 || 1.0 <= fVar2) {
      fVar2 = (float)(~-(uint)(fVar2 < 1.0) & 0x3f800000 | uVar3 & -(uint)(fVar2 < 1.0));
    }
  }
  return fVar2;
}

Assistant:

NK_API float
nk_layout_ratio_from_pixel(struct nk_context *ctx, float pixel_width)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(pixel_width);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    win = ctx->current;
    return NK_CLAMP(0.0f, pixel_width/win->bounds.x, 1.0f);
}